

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::SymHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,SymHash *this,string *name)

{
  __type _Var1;
  uint32_t uVar2;
  element_type *peVar3;
  Sym *__y;
  int local_8c;
  pair<int,_Elf64_Sym> local_88;
  uint local_68;
  undefined1 local_58 [8];
  string candidateName;
  value_type candidate;
  Word i;
  uint32_t bucket;
  string *name_local;
  SymHash *this_local;
  
  uVar2 = anon_unknown_20::elf_hash(name);
  candidate.st_size._4_4_ = uVar2 % this->nbucket;
  candidate.st_size._0_4_ = this->buckets[candidate.st_size._4_4_];
  while( true ) {
    if ((Word)candidate.st_size == 0) {
      local_8c = 0;
      __y = undef();
      std::make_pair<int,Elf64_Sym_const&>(&local_88,&local_8c,__y);
      std::pair<unsigned_int,_Elf64_Sym>::pair<int,_Elf64_Sym,_true>
                (__return_storage_ptr__,&local_88);
      return __return_storage_ptr__;
    }
    peVar3 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->syms);
    Reader::readObj<Elf64_Sym>
              ((value_type *)((long)&candidateName.field_2 + 8),peVar3,
               (ulong)(Word)candidate.st_size * 0x18);
    peVar3 = std::
             __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->strings);
    (*peVar3->_vptr_Reader[7])(local_58,peVar3,(ulong)(uint)candidateName.field_2._8_4_);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,name);
    if (_Var1) {
      std::make_pair<unsigned_int&,Elf64_Sym&>
                (__return_storage_ptr__,(uint *)&candidate.st_size,
                 (value_type *)((long)&candidateName.field_2 + 8));
    }
    local_68 = (uint)_Var1;
    std::__cxx11::string::~string((string *)local_58);
    if (local_68 != 0) break;
    candidate.st_size._0_4_ = this->chains[(Word)candidate.st_size];
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<uint32_t, Sym>
SymHash::findSymbol(const string &name)
{
    uint32_t bucket = elf_hash(name) % nbucket;
    for (Word i = buckets[bucket]; i != STN_UNDEF; i = chains[i]) {
        auto candidate = syms->readObj<Sym>(i * sizeof (Sym));
        auto candidateName = strings->readString(candidate.st_name);
        if (candidateName == name)
            return std::make_pair(i, candidate);
    }
    return std::make_pair(0, undef());
}